

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::read_access_chain_array
          (CompilerHLSL *this,string *lhs,SPIRAccessChain *chain)

{
  undefined8 type_00;
  bool bVar1;
  uint32_t uVar2;
  size_t sVar3;
  SPIRType *pSVar4;
  string *ts_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_5;
  string local_168;
  ID local_144;
  string local_140;
  undefined1 local_120 [8];
  SPIRAccessChain subchain;
  undefined1 local_48 [8];
  string ident;
  SPIRType *type;
  SPIRAccessChain *chain_local;
  string *lhs_local;
  CompilerHLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(chain->super_IVariant).field_0xc);
  ident.field_2._8_8_ = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  get_unique_identifier_abi_cxx11_((string *)local_48,this);
  CompilerGLSL::statement<char_const(&)[9]>(&this->super_CompilerGLSL,(char (*) [9])"[unroll]");
  type_00 = ident.field_2._8_8_;
  sVar3 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(ident.field_2._8_8_ + 0x20));
  CompilerGLSL::to_array_size_abi_cxx11_
            ((string *)(subchain.implied_read_expressions.stack_storage.aligned_char + 0x18),
             &this->super_CompilerGLSL,(SPIRType *)type_00,(int)sVar3 - 1);
  ts_5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (subchain.implied_read_expressions.stack_storage.aligned_char + 0x18);
  CompilerGLSL::
  statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[7],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
            (&this->super_CompilerGLSL,(char (*) [10])"for (int ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (char (*) [7])" = 0; ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (char (*) [4])" < ",ts_5,(char (*) [3])0x663378,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (char (*) [4])0x68283d);
  ::std::__cxx11::string::~string
            ((string *)(subchain.implied_read_expressions.stack_storage.aligned_char + 0x18));
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  SPIRAccessChain::SPIRAccessChain((SPIRAccessChain *)local_120,chain);
  ts_3 = &chain->dynamic_index;
  join<std::__cxx11::string&,char_const(&)[4],unsigned_int_const&,char_const(&)[4],std::__cxx11::string_const&>
            (&local_140,(spirv_cross *)local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x672d14,
             (char (*) [4])&chain->array_stride,(uint *)0x66a9b3,(char (*) [4])ts_3,ts_5);
  ::std::__cxx11::string::operator=
            ((string *)(subchain.base.field_2._M_local_buf + 8),(string *)&local_140);
  ::std::__cxx11::string::~string((string *)&local_140);
  subchain.super_IVariant._vptr_IVariant._4_4_ = *(undefined4 *)(ident.field_2._8_8_ + 0x114);
  uVar2 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)((long)&subchain.super_IVariant._vptr_IVariant + 4));
  pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  bVar1 = VectorView<unsigned_int>::empty(&(pSVar4->array).super_VectorView<unsigned_int>);
  if (!bVar1) {
    TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>
              (&local_144,
               (TypedID<(spirv_cross::Types)1> *)((long)&subchain.super_IVariant._vptr_IVariant + 4)
              );
    subchain.loaded_from.id = Compiler::get_decoration((Compiler *)this,local_144,ArrayStride);
  }
  join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
            (&local_168,(spirv_cross *)lhs,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x623740,
             (char (*) [2])local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6629fd,
             (char (*) [2])ts_3);
  read_access_chain(this,(string *)0x0,&local_168,(SPIRAccessChain *)local_120);
  ::std::__cxx11::string::~string((string *)&local_168);
  CompilerGLSL::end_scope(&this->super_CompilerGLSL);
  SPIRAccessChain::~SPIRAccessChain((SPIRAccessChain *)local_120);
  ::std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void CompilerHLSL::read_access_chain_array(const string &lhs, const SPIRAccessChain &chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	// Need to use a reserved identifier here since it might shadow an identifier in the access chain input or other loops.
	auto ident = get_unique_identifier();

	statement("[unroll]");
	statement("for (int ", ident, " = 0; ", ident, " < ", to_array_size(type, uint32_t(type.array.size() - 1)), "; ",
	          ident, "++)");
	begin_scope();
	auto subchain = chain;
	subchain.dynamic_index = join(ident, " * ", chain.array_stride, " + ", chain.dynamic_index);
	subchain.basetype = type.parent_type;
	if (!get<SPIRType>(subchain.basetype).array.empty())
		subchain.array_stride = get_decoration(subchain.basetype, DecorationArrayStride);
	read_access_chain(nullptr, join(lhs, "[", ident, "]"), subchain);
	end_scope();
}